

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_twowaycouple_mri.c
# Opt level: O3

int fs(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  ulong uVar1;
  ulong *puVar2;
  
  uVar1 = *(ulong *)(*(long *)((long)y->content + 0x10) + 0x10);
  puVar2 = *(ulong **)((long)ydot->content + 0x10);
  *puVar2 = uVar1;
  puVar2[1] = 0;
  puVar2[2] = uVar1 ^ 0x8000000000000000;
  return 0;
}

Assistant:

static int fs(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype w = NV_Ith_S(y, 2); /* access solution values */

  /* fill in the RHS function */
  NV_Ith_S(ydot, 0) = w;
  NV_Ith_S(ydot, 1) = SUN_RCONST(0.0);
  NV_Ith_S(ydot, 2) = -w;

  /* Return with success */
  return 0;
}